

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::sortMaxDown
          (cbtAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          cbtDispatcher *dispatcher,bool updateOverlaps)

{
  unsigned_short *puVar1;
  short *psVar2;
  cbtOverlappingPairCallback *pcVar3;
  long lVar4;
  bool bVar5;
  Edge EVar6;
  long lVar7;
  uint axis0;
  undefined6 in_register_00000012;
  Edge *pEVar8;
  long lVar9;
  Handle *handle1;
  Handle *pHandleB;
  Handle *pHandleA;
  
  lVar9 = (long)axis;
  pEVar8 = this->m_pEdges[lVar9] + (CONCAT62(in_register_00000012,edge) & 0xffffffff);
  axis0 = 1 << (axis & 0x1fU) & 3;
  puVar1 = this->m_pHandles[pEVar8->m_handle].m_maxEdges + lVar9;
  EVar6.m_handle = 0;
  EVar6.m_pos = pEVar8->m_pos;
  lVar4 = 0x34;
  for (; EVar6.m_pos < pEVar8[-1].m_pos; pEVar8 = pEVar8 + -1) {
    pHandleB = this->m_pHandles + pEVar8[-1].m_handle;
    lVar7 = 0x3a;
    if (((pEVar8[-1].m_pos & 1) == 0) && (lVar7 = lVar4, updateOverlaps)) {
      pHandleA = this->m_pHandles + pEVar8->m_handle;
      bVar5 = testOverlap2D(this,pHandleA,pHandleB,axis0,1 << axis0 & 3);
      if (bVar5) {
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[3])
                  (this->m_pairCache,pHandleA,pHandleB,dispatcher);
        pcVar3 = this->m_userPairCallback;
        if (pcVar3 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar3->_vptr_cbtOverlappingPairCallback[3])(pcVar3,pHandleA,pHandleB,dispatcher);
        }
      }
    }
    psVar2 = (short *)((long)(pHandleB->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                      lVar9 * 2 + lVar7 + -0x14);
    *psVar2 = *psVar2 + 1;
    *puVar1 = *puVar1 - 1;
    EVar6 = *pEVar8;
    *pEVar8 = pEVar8[-1];
    pEVar8[-1] = EVar6;
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxDown(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (!pPrev->IsMax())
		{
			// if previous edge was a minimum remove any overlap between the two handles
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pPrev->m_handle);
			const int axis1 = (1 << axis) & 3;
			const int axis2 = (1 << axis1) & 3;

			if (updateOverlaps
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0, handle1, axis1, axis2)
#endif  //USE_OVERLAP_TEST_ON_REMOVES
			)
			{
				//this is done during the overlappingpairarray iteration/narrowphase collision

				m_pairCache->removeOverlappingPair(handle0, handle1, dispatcher);
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0, handle1, dispatcher);
			}

			// update edge reference in other handle
			pHandlePrev->m_minEdges[axis]++;
			;
		}
		else
			pHandlePrev->m_maxEdges[axis]++;

		pHandleEdge->m_maxEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}